

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_accelerator_intel
clCreateAcceleratorINTEL
          (cl_context context,cl_accelerator_type_intel accelerator_type,size_t descriptor_size,
          void *descriptor,cl_int *errcode_ret)

{
  bool bVar1;
  SConfig *pSVar2;
  time_point start;
  undefined4 *in_RCX;
  ulong in_RDX;
  cl_accelerator_type_intel in_ESI;
  cl_context in_RDI;
  uint *in_R8;
  cl_int in_stack_000000c4;
  char *in_stack_000000c8;
  CLIntercept *in_stack_000000d0;
  cl_accelerator_intel retVal;
  time_point cpuEnd;
  time_point cpuStart;
  cl_int localErrorCode;
  cl_motion_estimation_desc_intel *desc;
  uint64_t enqueueCounter;
  CLdispatchX *dispatchX;
  CLIntercept *pIntercept;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  CLIntercept *in_stack_fffffffffffffed0;
  allocator *in_stack_fffffffffffffed8;
  CLIntercept *in_stack_fffffffffffffee0;
  int local_10c;
  rep local_108;
  undefined8 local_100;
  allocator local_f1;
  string local_f0 [32];
  rep local_d0;
  undefined8 local_c8;
  uint64_t in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff4f;
  string *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  CLIntercept *in_stack_ffffffffffffff60;
  time_point in_stack_ffffffffffffff68;
  time_point in_stack_ffffffffffffff70;
  time_point end;
  rep local_70;
  undefined8 local_68;
  uint local_5c;
  undefined4 *local_58;
  uint64_t local_50;
  CLdispatchX *local_48;
  CLIntercept *local_40;
  uint *local_38;
  undefined4 *local_30;
  ulong local_28;
  cl_accelerator_type_intel local_1c;
  cl_context local_18;
  cl_accelerator_intel local_10;
  
  uVar3 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_40 = GetIntercept();
  if ((local_40 == (CLIntercept *)0x0) ||
     (local_48 = CLIntercept::dispatchX
                           ((CLIntercept *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (cl_context)
                            CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
     local_48->clCreateAcceleratorINTEL ==
     (_func_cl_accelerator_intel_cl_context_cl_accelerator_type_intel_size_t_void_ptr_cl_int_ptr *)
     0x0)) {
    local_10c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_10c);
    if (local_38 != (uint *)0x0) {
      *local_38 = 0xffffffde;
    }
    local_10 = (cl_accelerator_intel)0x0;
  }
  else {
    local_50 = CLIntercept::getEnqueueCounter
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if ((local_1c == 0) && (0xf < local_28)) {
      local_58 = local_30;
      pSVar2 = CLIntercept::config(local_40);
      if ((pSVar2->CallLogging & 1U) != 0) {
        in_stack_fffffffffffffeb0 = local_58[1];
        CLIntercept::callLoggingEnter
                  (local_40,"clCreateAcceleratorINTEL",local_50,(cl_kernel)0x0,
                   "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]"
                   ,local_18,CONCAT44(uVar3,*local_58),in_stack_fffffffffffffeb0,local_58[2],
                   local_58[3]);
      }
    }
    else {
      pSVar2 = CLIntercept::config(local_40);
      if ((pSVar2->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingEnter
                  (local_40,"clCreateAcceleratorINTEL",local_50,(cl_kernel)0x0,
                   "context = %p, accelerator_type = %u",local_18,CONCAT44(uVar3,local_1c));
      }
    }
    local_5c = 0;
    pSVar2 = CLIntercept::config(local_40);
    if ((((((pSVar2->CallLogging & 1U) != 0) ||
          (pSVar2 = CLIntercept::config(local_40), (pSVar2->ErrorLogging & 1U) != 0)) ||
         (pSVar2 = CLIntercept::config(local_40), (pSVar2->ErrorAssert & 1U) != 0)) ||
        (pSVar2 = CLIntercept::config(local_40), (pSVar2->NoErrors & 1U) != 0)) &&
       (local_38 == (uint *)0x0)) {
      local_38 = &local_5c;
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    pSVar2 = CLIntercept::config(local_40);
    if (((pSVar2->HostPerformanceTiming & 1U) != 0) ||
       (pSVar2 = CLIntercept::config(local_40), (pSVar2->ChromeCallLogging & 1U) != 0)) {
      local_68 = std::chrono::_V2::steady_clock::now();
    }
    start.__d.__r =
         (duration)
         (*local_48->clCreateAcceleratorINTEL)
                   (local_18,local_1c,local_28,local_30,(cl_int *)local_38);
    pSVar2 = CLIntercept::config(local_40);
    if (((pSVar2->HostPerformanceTiming & 1U) != 0) ||
       (pSVar2 = CLIntercept::config(local_40), (pSVar2->ChromeCallLogging & 1U) != 0)) {
      local_70 = std::chrono::_V2::steady_clock::now();
      end.__d.__r = (duration)(duration)local_70;
      pSVar2 = CLIntercept::config(local_40);
      if (((pSVar2->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_40,local_50), bVar1)) {
        in_stack_fffffffffffffee0 = local_40;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff58,"",(allocator *)&stack0xffffffffffffff57);
        local_c8 = local_68;
        local_d0 = local_70;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff70.__d.__r,
                   (char *)in_stack_ffffffffffffff68.__d.__r,(string *)in_stack_ffffffffffffff60,
                   start,end);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
      }
    }
    pSVar2 = CLIntercept::config(local_40);
    if (((((pSVar2->ErrorLogging & 1U) != 0) ||
         (pSVar2 = CLIntercept::config(local_40), (pSVar2->ErrorAssert & 1U) != 0)) ||
        (pSVar2 = CLIntercept::config(local_40), (pSVar2->NoErrors & 1U) != 0)) && (*local_38 != 0))
    {
      pSVar2 = CLIntercept::config(local_40);
      if ((pSVar2->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4);
      }
      pSVar2 = CLIntercept::config(local_40);
      if ((pSVar2->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar2 = CLIntercept::config(local_40);
      if ((pSVar2->NoErrors & 1U) != 0) {
        *local_38 = 0;
      }
    }
    pSVar2 = CLIntercept::config(local_40);
    if ((pSVar2->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (local_40,"clCreateAcceleratorINTEL",(cl_int)(ulong)*local_38,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",start.__d.__r);
    }
    pSVar2 = CLIntercept::config(local_40);
    if ((pSVar2->ChromeCallLogging & 1U) != 0) {
      in_stack_fffffffffffffed8 = &local_f1;
      in_stack_fffffffffffffed0 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"",in_stack_fffffffffffffed8);
      local_100 = local_68;
      local_108 = local_70;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (bool)in_stack_ffffffffffffff4f,in_stack_ffffffffffffff40,in_stack_ffffffffffffff70
                 ,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    }
    local_10 = (cl_accelerator_intel)start.__d.__r;
    if (start.__d.__r != 0) {
      CLIntercept::addAcceleratorInfo
                (in_stack_fffffffffffffee0,(cl_accelerator_intel)in_stack_fffffffffffffed8,
                 (cl_context)in_stack_fffffffffffffed0);
      local_10 = (cl_accelerator_intel)start.__d.__r;
    }
  }
  return local_10;
}

Assistant:

CL_API_ENTRY cl_accelerator_intel CL_API_CALL clCreateAcceleratorINTEL(
    cl_context context,
    cl_accelerator_type_intel accelerator_type,
    size_t descriptor_size,
    const void* descriptor,
    cl_int* errcode_ret )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clCreateAcceleratorINTEL )
        {
            GET_ENQUEUE_COUNTER();

            if( ( accelerator_type == CL_ACCELERATOR_TYPE_MOTION_ESTIMATION_INTEL ) &&
                ( descriptor_size >= sizeof( cl_motion_estimation_desc_intel ) ) )
            {
                cl_motion_estimation_desc_intel* desc =
                    (cl_motion_estimation_desc_intel*)descriptor;
                CALL_LOGGING_ENTER( "context = %p, motion_estimation_desc[ mb_block_type = %u, subpixel_mode = %u, sad_adjust_mode = %u, search_path_type = %u ]",
                    context,
                    desc->mb_block_type,
                    desc->subpixel_mode,
                    desc->sad_adjust_mode,
                    desc->search_path_type );
            }
            else
            {
                CALL_LOGGING_ENTER( "context = %p, accelerator_type = %u",
                    context,
                    accelerator_type );
            }
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_accelerator_intel retVal = dispatchX.clCreateAcceleratorINTEL(
                context,
                accelerator_type,
                descriptor_size,
                descriptor,
                errcode_ret);

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            //ADD_OBJECT_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addAcceleratorInfo(
                    retVal,
                    context );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_CONTEXT);
}